

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

Vec3fa __thiscall embree::HeightField::at(HeightField *this,size_t x,size_t y)

{
  undefined8 uVar1;
  undefined8 in_RCX;
  ulong in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  float fVar2;
  Vec3fa VVar3;
  float pz;
  float py;
  float px;
  Vec2f p;
  Color4 c;
  size_t height;
  size_t width;
  float local_fc;
  float local_d8;
  float local_c8;
  float local_b8 [6];
  undefined8 local_a0;
  long local_98;
  ulong local_88;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_18 = (long *)(in_RSI + 0x10);
  local_98 = *(long *)(*local_18 + 0x10);
  local_a0 = *(undefined8 *)(*local_18 + 0x18);
  local_88 = in_RDX;
  local_10 = local_18;
  local_8 = local_18;
  (**(code **)(*(long *)*local_18 + 0x20))(local_b8,(long *)*local_18,in_RDX,in_RCX);
  local_d8 = (float)local_88;
  local_fc = (float)(local_98 - 1);
  fVar2 = local_c8 * (*(float *)(in_RSI + 0x38) - *(float *)(in_RSI + 0x28)) +
          *(float *)(in_RSI + 0x28);
  uVar1 = CONCAT44(local_b8[0] * (*(float *)(in_RSI + 0x34) - *(float *)(in_RSI + 0x24)) +
                   *(float *)(in_RSI + 0x24),
                   (local_d8 / local_fc) * (*(float *)(in_RSI + 0x30) - *(float *)(in_RSI + 0x20)) +
                   *(float *)(in_RSI + 0x20));
  *in_RDI = uVar1;
  in_RDI[1] = (ulong)(uint)fVar2;
  VVar3.field_0.m128[2] = fVar2;
  VVar3.field_0._0_8_ = uVar1;
  VVar3.field_0.m128[3] = 0.0;
  return (Vec3fa)VVar3.field_0;
}

Assistant:

const Vec3fa at(const size_t x, const size_t y)
    {
      const size_t width  = texture->width;
      const size_t height = texture->height;
      const Color4 c = texture->get(x,y);
      const Vec2f p(x/float(width-1),y/float(height-1));
      const float px = p.x*(bounds.upper.x-bounds.lower.x) + bounds.lower.x;
      const float py = c.r*(bounds.upper.y-bounds.lower.y) + bounds.lower.y;
      const float pz = p.y*(bounds.upper.z-bounds.lower.z) + bounds.lower.z;
      return Vec3fa(px,py,pz);
    }